

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O1

void __thiscall UnitTest1::CodeGenTest::DryParserGenTest1(CodeGenTest *this)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  size_t sVar3;
  __node_base _Var4;
  char *in_RSI;
  ulong uVar5;
  StringLogger logger;
  Grammar<unsigned_char> grammar;
  char msg [256];
  stat st;
  DryParserEM64T<unsigned_char> parser;
  Stage1Runner runner;
  StringLogger local_748;
  Grammar<unsigned_char> local_710;
  timeval local_618 [16];
  stat local_518;
  DryParserEM64T<unsigned_char> local_488;
  Stage1Runner local_298;
  
  LoadGrammar<unsigned_char>(&local_710,in_RSI);
  for (_Var4._M_nxt = local_710.m_networks._M_h._M_before_begin._M_nxt;
      _Var4._M_nxt != (_Hash_node_base *)0x0; _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
    Centaurus::ATNMachine<unsigned_char>::drop_passthrough_nodes
              ((ATNMachine<unsigned_char> *)(_Var4._M_nxt + 6));
  }
  ::asmjit::StringLogger::StringLogger(&local_748);
  Centaurus::DryParserEM64T<unsigned_char>::DryParserEM64T
            (&local_488,&local_710,&local_748.super_Logger);
  stat("../../datasets/citylots.json",&local_518);
  Centaurus::Stage1Runner::Stage1Runner
            (&local_298,"../../datasets/citylots.json",&local_488.super_IParser,0x800000,8,false,
             false);
  gettimeofday(local_618,(__timezone_ptr_t)0x0);
  _Var2 = local_618[0].tv_usec;
  _Var1 = local_618[0].tv_sec;
  Centaurus::BaseRunner::_start<Centaurus::Stage1Runner>(&local_298.super_BaseRunner);
  pthread_join(local_298.super_BaseRunner.m_thread,(void **)0x0);
  gettimeofday(local_618,(__timezone_ptr_t)0x0);
  uVar5 = (local_618[0].tv_sec - _Var1) * 1000000 + (local_618[0].tv_usec - _Var2);
  sprintf((char *)local_618,"Elapsed time: %lu[ms]\r\n",uVar5 / 1000);
  sVar3 = strlen((char *)local_618);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_618,sVar3);
  sprintf((char *)local_618,"Throughput: %lu[MB/s]\r\n",(ulong)local_518.st_size / uVar5);
  sVar3 = strlen((char *)local_618);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_618,sVar3);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::IsTrue
            (local_298.m_result != (void *)0x0,(wchar_t *)0x0);
  Centaurus::Stage1Runner::~Stage1Runner(&local_298);
  local_488.super_IParser._vptr_IParser = (_func_int **)&PTR__DryParserEM64T_001c98d8;
  ::asmjit::CodeHolder::~CodeHolder(&local_488.m_code);
  ::asmjit::JitRuntime::~JitRuntime(&local_488.m_runtime);
  ::asmjit::StringLogger::~StringLogger(&local_748);
  Centaurus::Grammar<unsigned_char>::~Grammar(&local_710);
  return;
}

Assistant:

TEST_METHOD(DryParserGenTest1)
    {
        using namespace Centaurus;

        Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("../../grammar/json2.cgr");
        //Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("grammar/xml.cgr");

		grammar.optimize();

		/*FILE *logFile;
		fopen_s(&logFile, "parser.asm", "w");
        asmjit::FileLogger logger(logFile);*/

        asmjit::StringLogger logger;
		
        DryParserEM64T<unsigned char> parser(grammar, &logger);

        //std::cout << logger.getString() << std::endl;

		//fclose(logFile);

        //Logger::WriteMessage(logger.getString());

        //MappedFileInput json("/home/ihara/Downloads/sf-city-lots-json-master/citylots.json");

#if defined(CENTAURUS_BUILD_WINDOWS)
		const char *input_path = "..\\..\\datasets\\citylots.json";
		//const char *input_path = "test2.json";
#elif defined(CENTAURUS_BUILD_LINUX)
        const char *input_path = "../../datasets/citylots.json";
#endif
        struct stat st;
        stat(input_path, &st);

        Stage1Runner runner{input_path, &parser, 8 * 1024 * 1024, 8};

		uint64_t start_time = get_us_clock();

        runner.start();
        runner.wait();

		uint64_t end_time = get_us_clock();

		char msg[256];
		sprintf(msg, "Elapsed time: %lu[ms]\r\n", (end_time - start_time) / 1000);
		Logger::WriteMessage(msg);

        sprintf(msg, "Throughput: %lu[MB/s]\r\n", st.st_size / (end_time - start_time));
        Logger::WriteMessage(msg);

        //Assert::AreEqual((const void *)(json + strlen(json)), context.result);
        Assert::IsTrue(runner.get_result() != NULL);

        //_aligned_free(json);
    }